

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

void use_crystal_ball(obj *obj)

{
  undefined8 uVar1;
  d_level *lev;
  xchar xVar2;
  schar sVar3;
  boolean bVar4;
  char cVar5;
  schar sVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  char ch;
  uint uVar10;
  char *pcVar11;
  byte bVar12;
  
  if (u.uprops[0x1e].intrinsic != 0) {
LAB_0015fa4e:
    if (ublindf != (obj *)0x0) {
LAB_0015fa53:
      if (ublindf->oartifact == '\x1d') goto LAB_0015faa6;
    }
    pcVar8 = xname(obj);
    pcVar8 = the(pcVar8);
    pcVar11 = "Too bad you can\'t see %s.";
LAB_0015fa70:
    pline(pcVar11,pcVar8);
    return;
  }
  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0015fa53;
  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0015fa4e;
LAB_0015faa6:
  iVar7 = 0xd;
  if ((obj->field_0x4a & 2) == 0) {
    iVar7 = 0x14;
  }
  iVar7 = rnd(iVar7);
  sVar3 = acurr(1);
  if (((sVar3 < iVar7) || ((obj->field_0x4a & 1) != 0)) && ('\0' < obj->spe)) {
    uVar10 = 4;
    if ((obj->oartifact == '\0') && ((obj->field_0x4a & 2) == 0)) {
      sVar3 = acurr(1);
      uVar10 = '\x11' < sVar3 ^ 5;
    }
    iVar7 = rnd(uVar10);
    switch(iVar7) {
    case 1:
      pcVar8 = Tobjnam(obj,"are");
      pcVar11 = "%s too much to comprehend!";
      goto LAB_0015fb30;
    case 2:
      Tobjnam(obj,"confuse");
      pline("%s you!");
      uVar10 = u.uprops[0x1c].intrinsic;
      iVar7 = rnd(100);
      make_confused((ulong)(uVar10 + iVar7),'\0');
      break;
    case 3:
      bVar4 = resists_blnd(&youmonst);
      if (bVar4 != '\0') {
        pcVar8 = Tobjnam(obj,"assault");
        pline("%s your vision.",pcVar8);
        pcVar8 = "You are unaffected!";
        goto LAB_0015ffc2;
      }
      Tobjnam(obj,"damage");
      pline("%s your vision!");
      uVar10 = u.uprops[0x1e].intrinsic;
      iVar7 = rnd(100);
      make_blinded((ulong)(uVar10 + iVar7),'\0');
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0015fecf;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0015fec6;
      }
      else {
LAB_0015fec6:
        if (ublindf == (obj *)0x0) break;
LAB_0015fecf:
        if (ublindf->oartifact != '\x1d') break;
      }
      pcVar8 = "Your vision quickly clears.";
      goto LAB_0015ffc2;
    case 4:
      Tobjnam(obj,"zap");
      pline("%s your mind!");
      uVar10 = u.uprops[0x23].intrinsic;
      iVar7 = rnd(100);
      make_hallucinated((ulong)(uVar10 + iVar7),'\0',0);
      break;
    case 5:
      pcVar8 = Tobjnam(obj,"explode");
      pline("%s!",pcVar8);
      useup(obj);
      iVar7 = rnd(0x1e);
      losehp(iVar7,"exploding crystal ball",0);
      return;
    }
    goto switchD_0015fb15_default;
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
    if (flags.verbose != '\0') {
      pline("You may look for an object or monster symbol.");
    }
    cVar5 = query_key("What do you look for?",(int *)0x0);
    if ((cVar5 != ' ') && (pcVar8 = strchr(" \r\n\x1b",(int)cVar5), pcVar8 != (char *)0x0)) {
      if (flags.verbose == '\0') {
        return;
      }
      pcVar8 = "Never mind.";
      goto LAB_0015fe49;
    }
    pcVar8 = xname(obj);
    pcVar8 = the(pcVar8);
    pline("You peer into %s...",pcVar8);
    iVar7 = rnd((uint)(u.uprops[0x38].extrinsic == 0) * 8 + 2);
    nomul(-iVar7,"gazing into a crystal ball");
    nomovemsg = "";
    if ('\0' < obj->spe) {
      discover_object(0xec,'\x01','\x01');
      consume_obj_charge(obj,'\x01');
      ch = 'm';
      if (cVar5 != ']') {
        ch = cVar5;
      }
      iVar7 = def_char_to_objclass(ch);
      if (iVar7 == 0x12) {
        iVar7 = def_char_to_monclass(ch);
        if (iVar7 == 0x3d) {
          if (ch != '^') {
            uVar10 = mt_random();
            uVar9 = (ulong)((uVar10 & 3) << 4);
            uVar1 = *(undefined8 *)((long)&level_detects[0].what + uVar9);
            lev = *(d_level **)((long)&level_detects[0].where + uVar9);
            sVar3 = depth(&u.uz);
            sVar6 = depth(lev);
            xVar2 = u.uz.dnum;
            bVar12 = sVar3 - sVar6;
            cVar5 = lev->dnum;
            if ((char)bVar12 < '\0') {
              uVar10 = mt_random();
              if ((int)(char)bVar12 < (int)(-8 - uVar10 % 3)) {
                pcVar8 = "far below";
LAB_00160022:
                pcVar11 = "far away";
                goto LAB_0016005b;
              }
              if (bVar12 != 0xff) {
                pcVar8 = "below you";
                pcVar11 = "away below you";
                goto LAB_0016005b;
              }
              pcVar8 = "just below";
            }
            else if (sVar3 == sVar6) {
              pcVar8 = "near you";
            }
            else {
              uVar10 = mt_random();
              if ((int)(uVar10 % 3 | 8) < (int)(char)bVar12) {
                pcVar8 = "far above";
                goto LAB_00160022;
              }
              if (1 < bVar12) {
                pcVar8 = "above you";
                pcVar11 = "away above you";
                goto LAB_0016005b;
              }
              pcVar8 = "just above";
            }
            pcVar11 = "in the distance";
LAB_0016005b:
            if (xVar2 == cVar5) {
              pcVar11 = pcVar8;
            }
            pline("You see %s, %s.",uVar1,pcVar11);
            return;
          }
          iVar7 = trap_detect((obj *)0x0);
        }
        else {
          iVar7 = monster_detect((obj *)0x0,iVar7);
        }
      }
      else {
        iVar7 = object_detect((obj *)0x0,iVar7,'\0');
      }
      if (iVar7 == 0) {
        return;
      }
      uVar10 = mt_random();
      if (uVar10 % 100 == 0) {
        pcVar8 = "You see the Wizard of Yendor gazing out at you.";
        goto LAB_0015fe49;
      }
    }
    pcVar8 = "The vision is unclear.";
LAB_0015fe49:
    pline(pcVar8);
    return;
  }
  if (obj->spe == '\0') {
    pcVar8 = hcolor((char *)0x0);
    pcVar11 = "All you see is funky %s haze.";
    goto LAB_0015fa70;
  }
  iVar7 = rnd(6);
  switch(iVar7) {
  case 1:
    pcVar8 = "You grok some groovy globs of incandescent lava.";
    break;
  case 2:
    iVar7 = poly_gender();
    pcVar8 = "dude";
    if (iVar7 == 1) {
      pcVar8 = "babe";
    }
    pcVar11 = "Whoa!  Psychedelic colors, %s!";
    goto LAB_0015fb30;
  case 3:
    pcVar8 = hcolor((char *)0x0);
    pcVar11 = "The crystal pulses with sinister %s light!";
LAB_0015fb30:
    pline(pcVar11,pcVar8);
    goto switchD_0015fb15_default;
  case 4:
    pcVar8 = "You see goldfish swimming above fluorescent rocks.";
    break;
  case 5:
    pcVar8 = "You see tiny snowflakes spinning around a miniature farmhouse.";
    break;
  default:
    pcVar8 = "Oh wow... like a kaleidoscope!";
  }
LAB_0015ffc2:
  pline(pcVar8);
switchD_0015fb15_default:
  consume_obj_charge(obj,'\x01');
  return;
}

Assistant:

void use_crystal_ball(struct obj *obj)
{
    char ch;
    int oops;

    if (Blind) {
	pline("Too bad you can't see %s.", the(xname(obj)));
	return;
    }
    oops = (rnd(obj->blessed ? 13 : 20) > ACURR(A_INT) || obj->cursed);
    if (oops && (obj->spe > 0)) {
	switch (rnd((obj->oartifact || obj->blessed || ACURR(A_INT) >= 18) ? 4 : 5)) {
	case 1 : pline("%s too much to comprehend!", Tobjnam(obj, "are"));
	    break;
	case 2 : pline("%s you!", Tobjnam(obj, "confuse"));
	    make_confused(HConfusion + rnd(100),FALSE);
	    break;
	case 3 : if (!resists_blnd(&youmonst)) {
		pline("%s your vision!", Tobjnam(obj, "damage"));
		make_blinded(Blinded + rnd(100),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    } else {
		pline("%s your vision.", Tobjnam(obj, "assault"));
		pline("You are unaffected!");
	    }
	    break;
	case 4 : pline("%s your mind!", Tobjnam(obj, "zap"));
	    make_hallucinated(HHallucination + rnd(100),FALSE,0L);
	    break;
	case 5 : pline("%s!", Tobjnam(obj, "explode"));
	    useup(obj);
	    obj = 0;	/* it's gone */
	    losehp(rnd(30), "exploding crystal ball", KILLED_BY_AN);
	    break;
	}
	if (obj) consume_obj_charge(obj, TRUE);
	return;
    }

    if (Hallucination) {
	if (!obj->spe) {
	    pline("All you see is funky %s haze.", hcolor(NULL));
	} else {
	    switch(rnd(6)) {
	    case 1 : pline("You grok some groovy globs of incandescent lava.");
		break;
	    case 2 : pline("Whoa!  Psychedelic colors, %s!",
			   poly_gender() == 1 ? "babe" : "dude");
		break;
	    case 3 : pline("The crystal pulses with sinister %s light!",
				hcolor(NULL));
		break;
	    case 4 : pline("You see goldfish swimming above fluorescent rocks.");
		break;
	    case 5 : pline("You see tiny snowflakes spinning around a miniature farmhouse.");
		break;
	    default: pline("Oh wow... like a kaleidoscope!");
		break;
	    }
	    consume_obj_charge(obj, TRUE);
	}
	return;
    }

    /* read a single character */
    if (flags.verbose) pline("You may look for an object or monster symbol.");
    ch = query_key("What do you look for?", NULL);
    /* Don't filter out ' ' here; it has a use */
    if ((ch != def_monsyms[S_GHOST]) && strchr(quitchars,ch)) { 
	if (flags.verbose) pline("Never mind.");
	return;
    }
    pline("You peer into %s...", the(xname(obj)));
    nomul(-rnd(Free_action ? 2 : 10), "gazing into a crystal ball");
    nomovemsg = "";
    if (obj->spe <= 0)
	pline("The vision is unclear.");
    else {
	int class;
	int ret = 0;

	makeknown(CRYSTAL_BALL);
	consume_obj_charge(obj, TRUE);

	/* special case: accept ']' as synonym for mimic
	 * we have to do this before the def_char_to_objclass check
	 */
	if (ch == DEF_MIMIC_DEF) ch = DEF_MIMIC;

	if ((class = def_char_to_objclass(ch)) != MAXOCLASSES)
		ret = object_detect(NULL, class, FALSE);
	else if ((class = def_char_to_monclass(ch)) != MAXMCLASSES)
		ret = monster_detect(NULL, class);
	else switch(ch) {
		case '^':
		    ret = trap_detect(NULL);
		    break;
		default:
		    {
		    int i = rn2(SIZE(level_detects));
		    pline("You see %s, %s.",
			level_detects[i].what,
			level_distance(level_detects[i].where));
		    }
		    ret = 0;
		    break;
	}

	if (ret) {
	    if (!rn2(100))  /* make them nervous */
		pline("You see the Wizard of Yendor gazing out at you.");
	    else pline("The vision is unclear.");
	}
    }
    return;
}